

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O2

Mfs_Man_t * Mfs_ManAlloc(Mfs_Par_t *pPars)

{
  ulong uVar1;
  int iVar2;
  Mfs_Man_t *pMVar3;
  Vec_Int_t *pVVar4;
  void **ppvVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  Int_Man_t *pIVar8;
  Vec_Vec_t *pVVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  pMVar3 = (Mfs_Man_t *)calloc(1,0x388);
  pMVar3->pPars = pPars;
  pVVar4 = Vec_IntAlloc(100);
  pMVar3->vProjVarsCnf = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pMVar3->vProjVarsSat = pVVar4;
  pVVar4 = Vec_IntAlloc(100);
  pMVar3->vDivLits = pVVar4;
  iVar2 = pPars->nWinMax;
  iVar10 = (((int)(iVar2 + 0xcU) >> 5) + 1) - (uint)((iVar2 + 0xcU & 0x1f) == 0);
  pMVar3->nDivWords = iVar10;
  uVar1 = (long)iVar2 + 0xd;
  ppvVar5 = (void **)malloc(((long)iVar10 * 4 + 8) * uVar1);
  uVar6 = 0;
  iVar13 = (int)uVar1;
  uVar11 = 0;
  if (0 < iVar13) {
    uVar11 = uVar1 & 0xffffffff;
  }
  lVar12 = (long)iVar2 * 8 + 0x68;
  for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    ppvVar5[uVar6] = (void *)((long)ppvVar5 + lVar12);
    lVar12 = lVar12 + (long)iVar10 * 4;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nSize = iVar13;
  pVVar7->nCap = iVar13;
  pVVar7->pArray = ppvVar5;
  pMVar3->vDivCexes = pVVar7;
  pIVar8 = Int_ManAlloc();
  pMVar3->pMan = pIVar8;
  pVVar4 = Vec_IntAlloc(0);
  pMVar3->vMem = pVVar4;
  pVVar9 = (Vec_Vec_t *)malloc(0x10);
  pVVar9->nCap = 0x20;
  ppvVar5 = (void **)malloc(0x100);
  pVVar9->pArray = ppvVar5;
  for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
    pVVar7 = Vec_PtrAlloc(0);
    ppvVar5[lVar12] = pVVar7;
  }
  pVVar9->nSize = 0x20;
  pMVar3->vLevels = pVVar9;
  pVVar7 = Vec_PtrAlloc(0x20);
  pMVar3->vMfsFanins = pVVar7;
  return pMVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mfs_Man_t * Mfs_ManAlloc( Mfs_Par_t * pPars )
{
    Mfs_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Mfs_Man_t, 1 );
    memset( p, 0, sizeof(Mfs_Man_t) );
    p->pPars     = pPars;
    p->vProjVarsCnf = Vec_IntAlloc( 100 );
    p->vProjVarsSat = Vec_IntAlloc( 100 );
    p->vDivLits  = Vec_IntAlloc( 100 );
    p->nDivWords = Abc_BitWordNum(p->pPars->nWinMax + MFS_FANIN_MAX);
    p->vDivCexes = Vec_PtrAllocSimInfo( p->pPars->nWinMax + MFS_FANIN_MAX + 1, p->nDivWords );
    p->pMan      = Int_ManAlloc();
    p->vMem      = Vec_IntAlloc( 0 );
    p->vLevels   = Vec_VecStart( 32 );
    p->vMfsFanins= Vec_PtrAlloc( 32 );
    return p;
}